

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFontGlyphRangesBuilder::AddText(ImFontGlyphRangesBuilder *this,char *text,char *text_end)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  ulong in_RAX;
  uint c;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  do {
    if (text_end == (char *)0x0) {
      uVar2 = (uint)*text;
    }
    else {
      uVar2 = (uint)(text < text_end);
    }
    if (uVar2 == 0) {
      return;
    }
    uStack_28 = uStack_28 & 0xffffffff;
    iVar3 = ImTextCharFromUtf8((uint *)((long)&uStack_28 + 4),text,text_end);
    if (iVar3 == 0) {
      return;
    }
    if (uStack_28._4_4_ < 0x10000) {
      if (*(int *)this <= (int)(uStack_28._4_4_ >> 5)) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                      ,0x4e6,"T &ImVector<unsigned int>::operator[](int) [T = unsigned int]");
      }
      puVar1 = (uint *)(*(long *)(this + 8) + (ulong)(uStack_28._4_4_ >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)(uStack_28 >> 0x20) & 0x1f);
    }
    text = text + iVar3;
  } while (iVar3 != 0);
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::AddText(const char* text, const char* text_end)
{
    while (text_end ? (text < text_end) : *text)
    {
        unsigned int c = 0;
        int c_len = ImTextCharFromUtf8(&c, text, text_end);
        text += c_len;
        if (c_len == 0)
            break;
        if (c < 0x10000)
            AddChar((ImWchar)c);
    }
}